

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void replace_defined(c2m_ctx_t c2m_ctx,VARR_token_t *expr_buffer)

{
  c2m_ctx_t pcVar1;
  short sVar2;
  int iVar3;
  uint uVar4;
  undefined4 *puVar5;
  c2m_ctx_t pcVar6;
  node_t pnVar7;
  c2m_ctx_t pcVar8;
  char *pcVar9;
  int iVar10;
  node_t_conflict pnVar11;
  short *unaff_R12;
  c2m_ctx_t pcVar12;
  c2m_ctx_t pcVar13;
  bool bVar14;
  val vVar15;
  pos_t pVar16;
  macro_t tab_macro;
  macro macro_struct;
  val vStack_d0;
  val vStack_c0;
  char *pcStack_b0;
  short *psStack_a8;
  c2m_ctx_t pcStack_a0;
  c2m_ctx_t pcStack_98;
  c2m_ctx_t pcStack_90;
  c2m_ctx_t local_80;
  c2m_ctx_t local_78;
  pre_ctx *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  macro_t local_58;
  macro local_50;
  
  local_78 = c2m_ctx;
  if (expr_buffer != (VARR_token_t *)0x0) {
    local_70 = c2m_ctx->pre_ctx;
    pcVar13 = (c2m_ctx_t)&DAT_00000001;
    iVar10 = 0;
    local_80 = (c2m_ctx_t)expr_buffer;
    do {
      pcVar1 = (c2m_ctx_t)((long)&pcVar13[-1].gen_ctx + 7);
      pcVar12 = (c2m_ctx_t)((c2m_ctx_t)expr_buffer)->ctx;
      if (pcVar12 <= pcVar1) {
        return;
      }
      pnVar7 = (node_t)((c2m_ctx_t)expr_buffer)->env[0].__jmpbuf[0];
      if (pnVar7 == (node_t)0x0) {
        pcStack_90 = (c2m_ctx_t)0x1953ec;
        replace_defined_cold_3();
        pcVar9 = (char *)0x0;
LAB_001953ec:
        pcStack_90 = (c2m_ctx_t)0x1953f1;
        replace_defined_cold_2();
        pcVar6 = c2m_ctx;
        c2m_ctx = pcVar12;
LAB_001953f1:
        pcStack_90 = (c2m_ctx_t)eval;
        replace_defined_cold_1();
        pcStack_b0 = pcVar9;
        psStack_a8 = unaff_R12;
        pcStack_a0 = c2m_ctx;
        pcStack_98 = pcVar1;
        pcStack_90 = pcVar13;
        switch(*(node_code_t *)&((c2m_ctx_t)expr_buffer)->ctx) {
        case N_IGNORE:
          pVar16 = get_node_pos(pcVar6,(node_t_conflict)expr_buffer);
          error(pcVar6,0x1c3235,pVar16.fname,pVar16._8_8_);
          return;
        case N_I:
        case N_L:
        case N_LL:
          return;
        case N_U:
        case N_UL:
        case N_ULL:
        case N_CH16:
        case N_CH32:
          return;
        default:
          __assert_fail("FALSE",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0xddc,"struct val eval(c2m_ctx_t, node_t)");
        case N_CH:
          return;
        case N_ANDAND:
        case N_OROR:
          vVar15 = eval(pcVar6,(node_t_conflict)((c2m_ctx_t)expr_buffer)->env[0].__jmpbuf[2]);
          vStack_d0.u = vVar15.u;
          vStack_d0.uns_p = vVar15.uns_p;
          if (*(node_code_t *)&((c2m_ctx_t)expr_buffer)->ctx == N_ANDAND) {
            if (vStack_d0.u.i_val == 0) {
              return;
            }
          }
          else if (vStack_d0.u.i_val != 0) {
            return;
          }
          pnVar11 = (node_t_conflict)((c2m_ctx_t)expr_buffer)->env[0].__jmpbuf[2];
          if (pnVar11 != (node_t_conflict)0x0) {
            pnVar11 = (pnVar11->op_link).next;
          }
          eval(pcVar6,pnVar11);
          return;
        case N_EQ:
          eval_binop_operands(pcVar6,(node_t_conflict)expr_buffer,&vStack_d0,&vStack_c0);
          return;
        case N_NE:
          eval_binop_operands(pcVar6,(node_t_conflict)expr_buffer,&vStack_d0,&vStack_c0);
          return;
        case N_LT:
          eval_binop_operands(pcVar6,(node_t_conflict)expr_buffer,&vStack_d0,&vStack_c0);
          return;
        case N_LE:
          eval_binop_operands(pcVar6,(node_t_conflict)expr_buffer,&vStack_d0,&vStack_c0);
          return;
        case N_GT:
          eval_binop_operands(pcVar6,(node_t_conflict)expr_buffer,&vStack_d0,&vStack_c0);
          return;
        case N_GE:
          eval_binop_operands(pcVar6,(node_t_conflict)expr_buffer,&vStack_d0,&vStack_c0);
          return;
        case N_BITWISE_NOT:
          eval(pcVar6,(node_t_conflict)((c2m_ctx_t)expr_buffer)->env[0].__jmpbuf[2]);
          return;
        case N_NOT:
          eval(pcVar6,(node_t_conflict)((c2m_ctx_t)expr_buffer)->env[0].__jmpbuf[2]);
          return;
        case N_AND:
          eval_binop_operands(pcVar6,(node_t_conflict)expr_buffer,&vStack_d0,&vStack_c0);
          return;
        case N_OR:
          eval_binop_operands(pcVar6,(node_t_conflict)expr_buffer,&vStack_d0,&vStack_c0);
          return;
        case N_XOR:
          eval_binop_operands(pcVar6,(node_t_conflict)expr_buffer,&vStack_d0,&vStack_c0);
          return;
        case N_LSH:
          eval_binop_operands(pcVar6,(node_t_conflict)expr_buffer,&vStack_d0,&vStack_c0);
          return;
        case N_RSH:
          eval_binop_operands(pcVar6,(node_t_conflict)expr_buffer,&vStack_d0,&vStack_c0);
          return;
        case N_ADD:
          pnVar11 = (node_t_conflict)((c2m_ctx_t)expr_buffer)->env[0].__jmpbuf[2];
          if ((pnVar11 != (node_t_conflict)0x0) && ((pnVar11->op_link).next != (node_t)0x0)) {
            eval_binop_operands(pcVar6,(node_t_conflict)expr_buffer,&vStack_d0,&vStack_c0);
            return;
          }
          eval(pcVar6,pnVar11);
          return;
        case N_SUB:
          pnVar11 = (node_t_conflict)((c2m_ctx_t)expr_buffer)->env[0].__jmpbuf[2];
          if ((pnVar11 != (node_t_conflict)0x0) && ((pnVar11->op_link).next != (node_t)0x0)) {
            eval_binop_operands(pcVar6,(node_t_conflict)expr_buffer,&vStack_d0,&vStack_c0);
            return;
          }
          eval(pcVar6,pnVar11);
          return;
        case N_MUL:
          eval_binop_operands(pcVar6,(node_t_conflict)expr_buffer,&vStack_d0,&vStack_c0);
          return;
        case N_DIV:
        case N_MOD:
          iVar10 = eval_binop_operands(pcVar6,(node_t_conflict)expr_buffer,&vStack_d0,&vStack_c0);
          bVar14 = vStack_c0.u.i_val == 0;
          if (iVar10 == 0) {
            if (vStack_c0.u.i_val != 0) {
              bVar14 = false;
            }
          }
          else if (vStack_c0.u.i_val != 0) {
            bVar14 = false;
          }
          if (!bVar14) {
            return;
          }
          pVar16 = get_node_pos(pcVar6,(node_t_conflict)expr_buffer);
          pcVar9 = "%";
          if (*(node_code_t *)&((c2m_ctx_t)expr_buffer)->ctx == N_DIV) {
            pcVar9 = "/";
          }
          error(pcVar6,0x1c3253,pVar16.fname,pVar16._8_8_,pcVar9);
          return;
        case N_COND:
          goto switchD_00195423_caseD_37;
        }
      }
      unaff_R12 = (short *)(&pnVar7[1].attr)[(long)&pcVar13[-1].gen_ctx];
      if (*unaff_R12 == 0x103) {
        c2m_ctx = *(c2m_ctx_t *)(unaff_R12 + 0x14);
        pcStack_90 = (c2m_ctx_t)0x1951db;
        iVar3 = strcmp((char *)c2m_ctx,"defined");
        expr_buffer = (VARR_token_t *)local_80;
        if (iVar3 == 0) {
          pcVar8 = pcVar13;
          if ((pcVar13 < pcVar12) && (**(short **)(&pnVar7->code + (long)pcVar13 * 2) == 0x20)) {
            pcVar8 = (c2m_ctx_t)((long)&pcVar13->ctx + 1);
          }
          if (pcVar8 < pcVar12) {
            sVar2 = *(short *)*(token_t *)(&pnVar7->code + (long)pcVar8 * 2);
            if (sVar2 == 0x28) {
              pcVar6 = (c2m_ctx_t)((long)&pcVar8->ctx + 1);
              if ((pcVar6 < pcVar12) && (*(&pnVar7->attr)[(long)&pcVar8->ctx] == 0x20)) {
                pcVar6 = (c2m_ctx_t)((long)&pcVar8->ctx + 2);
              }
              if ((pcVar6 < pcVar12) &&
                 (*(short *)*(token_t *)(&pnVar7->code + (long)pcVar6 * 2) == 0x103)) {
                c2m_ctx = (c2m_ctx_t)((long)&pcVar6->ctx + 1);
                if ((c2m_ctx < pcVar12) && (*(&pnVar7->attr)[(long)&pcVar6->ctx] == 0x20)) {
                  c2m_ctx = (c2m_ctx_t)((long)&pcVar6->ctx + 2);
                }
                if ((c2m_ctx < pcVar12) && (**(short **)(&pnVar7->code + (long)c2m_ctx * 2) == 0x29)
                   ) {
                  pcStack_90 = (c2m_ctx_t)0x19535a;
                  local_50.id = *(token_t *)(&pnVar7->code + (long)pcVar6 * 2);
                  iVar3 = HTAB_macro_t_do(local_70->macro_tab,&local_50,HTAB_FIND,&local_58);
                  pcVar9 = "0";
                  if (iVar3 != 0) {
                    pcVar9 = "1";
                  }
                  local_68 = *(undefined8 *)(unaff_R12 + 4);
                  uStack_60 = *(undefined8 *)(unaff_R12 + 8);
                  expr_buffer = (VARR_token_t *)0x30;
                  pcStack_90 = (c2m_ctx_t)0x195388;
                  puVar5 = (undefined4 *)reg_malloc(local_78,0x30);
                  *puVar5 = 0x100;
                  *(undefined8 *)(puVar5 + 2) = local_68;
                  *(undefined8 *)(puVar5 + 4) = uStack_60;
                  *(char **)(puVar5 + 10) = pcVar9;
                  puVar5[6] = 0;
                  *(undefined8 *)(puVar5 + 8) = 0;
                  pnVar7 = (node_t)local_80->env[0].__jmpbuf[0];
                  pcVar6 = local_80;
                  if ((pnVar7 == (node_t)0x0) ||
                     (pcVar8 = c2m_ctx, (c2m_ctx_t)local_80->ctx <= pcVar1)) goto LAB_001953f1;
                  goto LAB_001952b7;
                }
              }
            }
            else if (sVar2 == 0x103) {
              pcStack_90 = (c2m_ctx_t)0x19524a;
              local_50.id = *(token_t *)(&pnVar7->code + (long)pcVar8 * 2);
              iVar3 = HTAB_macro_t_do(local_70->macro_tab,&local_50,HTAB_FIND,&local_58);
              pcVar9 = "0";
              if (iVar3 != 0) {
                pcVar9 = "1";
              }
              local_68 = *(undefined8 *)(unaff_R12 + 4);
              uStack_60 = *(undefined8 *)(unaff_R12 + 8);
              expr_buffer = (VARR_token_t *)0x30;
              pcStack_90 = (c2m_ctx_t)0x195278;
              puVar5 = (undefined4 *)reg_malloc(local_78,0x30);
              *puVar5 = 0x100;
              *(undefined8 *)(puVar5 + 2) = local_68;
              *(undefined8 *)(puVar5 + 4) = uStack_60;
              *(char **)(puVar5 + 10) = pcVar9;
              puVar5[6] = 0;
              *(undefined8 *)(puVar5 + 8) = 0;
              pnVar7 = (node_t)local_80->env[0].__jmpbuf[0];
              c2m_ctx = local_80;
              pcVar12 = pcVar8;
              if ((pnVar7 == (node_t)0x0) || ((c2m_ctx_t)local_80->ctx <= pcVar1))
              goto LAB_001953ec;
LAB_001952b7:
              (&pnVar7[1].attr)[(long)&pcVar13[-1].gen_ctx] = puVar5;
              pcStack_90 = (c2m_ctx_t)0x1952c9;
              c2m_ctx = local_80;
              del_tokens((VARR_token_t *)local_80,(int)pcVar13,(int)pcVar8 + iVar10);
              expr_buffer = (VARR_token_t *)local_80;
            }
          }
        }
      }
      pcVar13 = (c2m_ctx_t)((long)&pcVar13->ctx + 1);
      iVar10 = iVar10 + -1;
    } while ((c2m_ctx_t)expr_buffer != (c2m_ctx_t)0x0);
  }
  pcStack_90 = (c2m_ctx_t)0x1953d8;
  replace_defined_cold_4();
  return;
switchD_00195423_caseD_37:
  vVar15 = eval(pcVar6,(node_t_conflict)((c2m_ctx_t)expr_buffer)->env[0].__jmpbuf[2]);
  vStack_d0.u = vVar15.u;
  vStack_d0.uns_p = vVar15.uns_p;
  pnVar11 = (node_t_conflict)((c2m_ctx_t)expr_buffer)->env[0].__jmpbuf[2];
  if (pnVar11 != (node_t_conflict)0x0) {
    uVar4 = (uint)(vStack_d0.u.i_val == 0);
    do {
      pnVar11 = (pnVar11->op_link).next;
      bVar14 = uVar4 != 0;
      uVar4 = uVar4 - 1;
      if (pnVar11 == (node_t)0x0) break;
    } while (bVar14);
  }
  eval(pcVar6,pnVar11);
  return;
}

Assistant:

static void replace_defined (c2m_ctx_t c2m_ctx, VARR (token_t) * expr_buffer) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  size_t i, j, k, len;
  token_t t, id;
  const char *res;
  struct macro macro_struct;
  macro_t tab_macro;

  for (i = 0; i < VARR_LENGTH (token_t, expr_buffer); i++) {
    /* Change defined ident and defined (ident) */
    t = VARR_GET (token_t, expr_buffer, i);
    if (t->code == T_ID && strcmp (t->repr, "defined") == 0) {
      j = i + 1;
      len = VARR_LENGTH (token_t, expr_buffer);
      if (j < len && VARR_GET (token_t, expr_buffer, j)->code == ' ') j++;
      if (j >= len) continue;
      if ((id = VARR_GET (token_t, expr_buffer, j))->code == T_ID) {
        macro_struct.id = id;
        res = HTAB_DO (macro_t, macro_tab, &macro_struct, HTAB_FIND, tab_macro) ? "1" : "0";
        VARR_SET (token_t, expr_buffer, i,
                  new_token (c2m_ctx, t->pos, res, T_NUMBER, N_IGNORE));  // ???
        del_tokens (expr_buffer, (int) i + 1, (int) (j - i));
        continue;
      }
      if (j >= len || VARR_GET (token_t, expr_buffer, j)->code != '(') continue;
      j++;
      if (j < len && VARR_GET (token_t, expr_buffer, j)->code == ' ') j++;
      if (j >= len || VARR_GET (token_t, expr_buffer, j)->code != T_ID) continue;
      k = j;
      j++;
      if (j < len && VARR_GET (token_t, expr_buffer, j)->code == ' ') j++;
      if (j >= len || VARR_GET (token_t, expr_buffer, j)->code != ')') continue;
      macro_struct.id = VARR_GET (token_t, expr_buffer, k);
      res = HTAB_DO (macro_t, macro_tab, &macro_struct, HTAB_FIND, tab_macro) ? "1" : "0";
      VARR_SET (token_t, expr_buffer, i,
                new_token (c2m_ctx, t->pos, res, T_NUMBER, N_IGNORE));  // ???
      del_tokens (expr_buffer, (int) i + 1, (int) (j - i));
    }
  }
}